

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtt_stats.cc
# Opt level: O3

void __thiscall quic::RttStats::OnConnectionMigration(RttStats *this)

{
  (this->mean_deviation_).time_offset_ = 0;
  (this->latest_rtt_).time_offset_ = 0;
  (this->min_rtt_).time_offset_ = 0;
  (this->smoothed_rtt_).time_offset_ = 0;
  (this->initial_rtt_).time_offset_ = 100000;
  (this->max_ack_delay_).time_offset_ = 0;
  return;
}

Assistant:

void RttStats::OnConnectionMigration() {
  latest_rtt_ = QuicTime::Delta::Zero();
  min_rtt_ = QuicTime::Delta::Zero();
  smoothed_rtt_ = QuicTime::Delta::Zero();
  mean_deviation_ = QuicTime::Delta::Zero();
  initial_rtt_ = QuicTime::Delta::FromMilliseconds(kInitialRttMs);
  max_ack_delay_ = QuicTime::Delta::Zero();
}